

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

int afm_stream_skip_spaces(AFM_Stream stream)

{
  byte bVar1;
  int in_EAX;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  if (0 < stream->status) {
    return in_EAX;
  }
  iVar2 = 3;
  pbVar3 = stream->cursor;
  if (stream->cursor < stream->limit) {
    do {
      pbVar4 = pbVar3 + 1;
      stream->cursor = pbVar4;
      bVar1 = *pbVar3;
      if (bVar1 < 0x1a) {
        if (bVar1 != 9) {
          if ((bVar1 != 10) && (bVar1 != 0xd)) {
            return 3;
          }
          iVar2 = 2;
          break;
        }
      }
      else if (bVar1 != 0x20) {
        if (bVar1 != 0x1a) {
          if (bVar1 != 0x3b) {
            return 3;
          }
          iVar2 = 1;
        }
        break;
      }
      pbVar3 = pbVar4;
    } while (pbVar4 != stream->limit);
  }
  stream->status = iVar2;
  return iVar2;
}

Assistant:

static int
  afm_stream_skip_spaces( AFM_Stream  stream )
  {
    int  ch = 0;  /* make stupid compiler happy */


    if ( AFM_STATUS_EOC( stream ) )
      return ';';

    while ( 1 )
    {
      ch = AFM_GETC();
      if ( !AFM_IS_SPACE( ch ) )
        break;
    }

    if ( AFM_IS_NEWLINE( ch ) )
      stream->status = AFM_STREAM_STATUS_EOL;
    else if ( AFM_IS_SEP( ch ) )
      stream->status = AFM_STREAM_STATUS_EOC;
    else if ( AFM_IS_EOF( ch ) )
      stream->status = AFM_STREAM_STATUS_EOF;

    return ch;
  }